

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

int __thiscall
deqp::egl::GLES2ThreadedSharingTest::init(GLES2ThreadedSharingTest *this,EVP_PKEY_CTX *ctx)

{
  Functions *dst;
  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
  *this_00;
  pointer ppEVar1;
  EGLThread *pEVar2;
  deUint32 dVar3;
  int extraout_EAX;
  Library *egl;
  EGLDisplay pvVar4;
  EGLConfig pvVar5;
  EGLThread *pEVar6;
  CreateContext *pCVar7;
  CreatePBufferSurface *pCVar8;
  MakeCurrent *pMVar9;
  InitGLExtension *pIVar10;
  DestroyContext *pDVar11;
  DestroySurface *pDVar12;
  GLenum type;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> contex1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> surface2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> surface1;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> contex2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_138;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_128;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_118;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_108;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_f8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_e8;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_d8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_c8;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_b8;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_a8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_98;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_88;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_78;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_68;
  EGLint attribList [7];
  
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  attribList[4] = 0x3021;
  attribList[5] = 1;
  attribList[6] = 0x3038;
  attribList[0] = 0x3040;
  attribList[1] = 4;
  attribList[2] = 0x3033;
  attribList[3] = 4;
  pvVar4 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_eglDisplay = pvVar4;
  pvVar5 = eglu::chooseSingleConfig(egl,pvVar4,attribList);
  this->m_eglConfig = pvVar5;
  dst = &this->m_gl;
  EglTestContext::initGLFunctions((this->super_TestCase).m_eglTestCtx,dst,(ApiType)0x2);
  if ((this->m_config).useFenceSync == true) {
    requireEGLExtension(egl,this->m_eglDisplay,"EGL_KHR_fence_sync");
  }
  if ((this->m_config).serverSync == true) {
    requireEGLExtension(egl,this->m_eglDisplay,"EGL_KHR_wait_sync");
  }
  if ((this->m_config).resourceType == RESOURCETYPE_IMAGE) {
    requireEGLExtension(egl,this->m_eglDisplay,"EGL_KHR_image_base");
    requireEGLExtension(egl,this->m_eglDisplay,"EGL_KHR_gl_texture_2D_image");
  }
  pEVar6 = (EGLThread *)operator_new(200);
  dVar3 = ::deInt32Hash(this->m_seed);
  GLES2ThreadTest::EGLThread::EGLThread(pEVar6,egl,dst,dVar3);
  this_00 = &this->m_threads;
  contex1.m_ptr = (GLES2Context *)pEVar6;
  std::
  vector<deqp::egl::GLES2ThreadTest::EGLThread*,std::allocator<deqp::egl::GLES2ThreadTest::EGLThread*>>
  ::emplace_back<deqp::egl::GLES2ThreadTest::EGLThread*>
            ((vector<deqp::egl::GLES2ThreadTest::EGLThread*,std::allocator<deqp::egl::GLES2ThreadTest::EGLThread*>>
              *)this_00,(EGLThread **)&contex1);
  pEVar6 = (EGLThread *)operator_new(200);
  dVar3 = ::deInt32Hash(this->m_seed * 200);
  GLES2ThreadTest::EGLThread::EGLThread(pEVar6,egl,dst,dVar3);
  contex1.m_ptr = (GLES2Context *)pEVar6;
  std::
  vector<deqp::egl::GLES2ThreadTest::EGLThread*,std::allocator<deqp::egl::GLES2ThreadTest::EGLThread*>>
  ::emplace_back<deqp::egl::GLES2ThreadTest::EGLThread*>
            ((vector<deqp::egl::GLES2ThreadTest::EGLThread*,std::allocator<deqp::egl::GLES2ThreadTest::EGLThread*>>
              *)this_00,(EGLThread **)&contex1);
  contex1.m_ptr = (GLES2Context *)0x0;
  contex1.m_state = (SharedPtrStateBase *)0x0;
  contex2.m_ptr = (GLES2Context *)0x0;
  contex2.m_state = (SharedPtrStateBase *)0x0;
  surface1.m_ptr = (Surface *)0x0;
  surface1.m_state = (SharedPtrStateBase *)0x0;
  surface2.m_ptr = (Surface *)0x0;
  surface2.m_state = (SharedPtrStateBase *)0x0;
  pEVar6 = *(this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar7 = (CreateContext *)operator_new(0x68);
  local_68.m_ptr = (GLES2Context *)0x0;
  local_68.m_state = (SharedPtrStateBase *)0x0;
  GLES2ThreadTest::CreateContext::CreateContext
            (pCVar7,this->m_eglDisplay,this->m_eglConfig,&local_68,&contex1);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pCVar7);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&local_68);
  pEVar6 = (this_00->
           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
           )._M_impl.super__Vector_impl_data._M_start[1];
  pCVar7 = (CreateContext *)operator_new(0x68);
  pvVar4 = this->m_eglDisplay;
  pvVar5 = this->m_eglConfig;
  local_b8.m_ptr = contex1.m_ptr;
  local_b8.m_state = contex1.m_state;
  if (contex1.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (contex1.m_state)->strongRefCount = (contex1.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (contex1.m_state)->weakRefCount = (contex1.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::CreateContext::CreateContext(pCVar7,pvVar4,pvVar5,&local_b8,&contex2);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pCVar7);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&local_b8);
  pEVar6 = *(this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar8 = (CreatePBufferSurface *)operator_new(0x60);
  GLES2ThreadTest::CreatePBufferSurface::CreatePBufferSurface
            (pCVar8,this->m_eglDisplay,this->m_eglConfig,400,400,&surface1);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pCVar8);
  pEVar6 = (this_00->
           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
           )._M_impl.super__Vector_impl_data._M_start[1];
  pCVar8 = (CreatePBufferSurface *)operator_new(0x60);
  GLES2ThreadTest::CreatePBufferSurface::CreatePBufferSurface
            (pCVar8,this->m_eglDisplay,this->m_eglConfig,400,400,&surface2);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pCVar8);
  ppEVar1 = (this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = *ppEVar1;
  pMVar9 = (MakeCurrent *)operator_new(0x60);
  pEVar2 = *ppEVar1;
  pvVar4 = this->m_eglDisplay;
  local_c8.m_ptr = surface1.m_ptr;
  local_c8.m_state = surface1.m_state;
  if (surface1.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (surface1.m_state)->strongRefCount = (surface1.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (surface1.m_state)->weakRefCount = (surface1.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_d8.m_ptr = contex1.m_ptr;
  local_d8.m_state = contex1.m_state;
  if (contex1.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (contex1.m_state)->strongRefCount = (contex1.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (contex1.m_state)->weakRefCount = (contex1.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar9,pEVar2,pvVar4,&local_c8,&local_d8);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pMVar9);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&local_d8);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::release(&local_c8);
  ppEVar1 = (this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = ppEVar1[1];
  pMVar9 = (MakeCurrent *)operator_new(0x60);
  pEVar2 = ppEVar1[1];
  pvVar4 = this->m_eglDisplay;
  local_e8.m_ptr = surface2.m_ptr;
  local_e8.m_state = surface2.m_state;
  if (surface2.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (surface2.m_state)->strongRefCount = (surface2.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (surface2.m_state)->weakRefCount = (surface2.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_f8.m_ptr = contex2.m_ptr;
  local_f8.m_state = contex2.m_state;
  if (contex2.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (contex2.m_state)->strongRefCount = (contex2.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (contex2.m_state)->weakRefCount = (contex2.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar9,pEVar2,pvVar4,&local_e8,&local_f8);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pMVar9);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&local_f8);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::release(&local_e8);
  if ((this->m_config).useFenceSync == true) {
    pEVar6 = *(this_00->
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pIVar10 = (InitGLExtension *)operator_new(0x58);
    GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar10,"GL_OES_EGL_sync");
    tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pIVar10);
    pEVar6 = (this_00->
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             )._M_impl.super__Vector_impl_data._M_start[1];
    pIVar10 = (InitGLExtension *)operator_new(0x58);
    GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar10,"GL_OES_EGL_sync");
    tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pIVar10);
  }
  switch((this->m_config).resourceType) {
  case RESOURCETYPE_BUFFER:
    addBufferOperations(this);
    break;
  case RESOURCETYPE_TEXTURE:
    addTextureOperations(this);
    break;
  case RESOURCETYPE_VERTEX_SHADER:
    type = 0x8b31;
    goto LAB_00dab5d2;
  case RESOURCETYPE_FRAGMENT_SHADER:
    type = 0x8b30;
LAB_00dab5d2:
    addShaderOperations(this,type);
    break;
  case RESOURCETYPE_PROGRAM:
    addProgramOperations(this);
    break;
  case RESOURCETYPE_IMAGE:
    addImageOperations(this);
  }
  ppEVar1 = (this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = *ppEVar1;
  pMVar9 = (MakeCurrent *)operator_new(0x60);
  local_78.m_ptr = (Surface *)0x0;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_88.m_ptr = (GLES2Context *)0x0;
  local_88.m_state = (SharedPtrStateBase *)0x0;
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar9,*ppEVar1,this->m_eglDisplay,&local_78,&local_88);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pMVar9);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&local_88);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::release(&local_78);
  ppEVar1 = (this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar6 = ppEVar1[1];
  pMVar9 = (MakeCurrent *)operator_new(0x60);
  local_98.m_ptr = (Surface *)0x0;
  local_98.m_state = (SharedPtrStateBase *)0x0;
  local_a8.m_ptr = (GLES2Context *)0x0;
  local_a8.m_state = (SharedPtrStateBase *)0x0;
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar9,*ppEVar1,this->m_eglDisplay,&local_98,&local_a8);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pMVar9);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&local_a8);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::release(&local_98);
  pEVar6 = *(this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar11 = (DestroyContext *)operator_new(0x48);
  local_108.m_ptr = contex1.m_ptr;
  local_108.m_state = contex1.m_state;
  if (contex1.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (contex1.m_state)->strongRefCount = (contex1.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (contex1.m_state)->weakRefCount = (contex1.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::DestroyContext::DestroyContext(pDVar11,&local_108);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pDVar11);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&local_108);
  pEVar6 = (this_00->
           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
           )._M_impl.super__Vector_impl_data._M_start[1];
  pDVar11 = (DestroyContext *)operator_new(0x48);
  local_118.m_ptr = contex2.m_ptr;
  local_118.m_state = contex2.m_state;
  if (contex2.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (contex2.m_state)->strongRefCount = (contex2.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (contex2.m_state)->weakRefCount = (contex2.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::DestroyContext::DestroyContext(pDVar11,&local_118);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pDVar11);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&local_118);
  pEVar6 = *(this_00->
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar12 = (DestroySurface *)operator_new(0x50);
  pvVar4 = this->m_eglDisplay;
  local_128.m_ptr = surface1.m_ptr;
  local_128.m_state = surface1.m_state;
  if (surface1.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (surface1.m_state)->strongRefCount = (surface1.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (surface1.m_state)->weakRefCount = (surface1.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::DestroySurface::DestroySurface(pDVar12,pvVar4,&local_128);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pDVar12);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::release(&local_128);
  pEVar6 = (this_00->
           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
           )._M_impl.super__Vector_impl_data._M_start[1];
  pDVar12 = (DestroySurface *)operator_new(0x50);
  pvVar4 = this->m_eglDisplay;
  local_138.m_ptr = surface2.m_ptr;
  local_138.m_state = surface2.m_state;
  if (surface2.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (surface2.m_state)->strongRefCount = (surface2.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (surface2.m_state)->weakRefCount = (surface2.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::DestroySurface::DestroySurface(pDVar12,pvVar4,&local_138);
  tcu::ThreadUtil::Thread::addOperation(&pEVar6->super_Thread,(Operation *)pDVar12);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::release(&local_138);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::release(&surface2);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::release(&surface1);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&contex2);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::release(&contex1);
  return extraout_EAX;
}

Assistant:

void GLES2ThreadedSharingTest::init (void)
{
	const Library& egl = m_eglTestCtx.getLibrary();

	const EGLint attribList[] =
	{
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
		EGL_ALPHA_SIZE,			1,
		EGL_NONE
	};

	m_eglDisplay	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig		= eglu::chooseSingleConfig(egl, m_eglDisplay, attribList);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	// Check extensions
	if (m_config.useFenceSync)
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_fence_sync");

	if (m_config.serverSync)
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_wait_sync");

	if (m_config.resourceType == TestConfig::RESOURCETYPE_IMAGE)
	{
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_image_base");
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_gl_texture_2D_image");
	}

	// Create threads
	m_threads.push_back(new GLES2ThreadTest::EGLThread(egl, m_gl, deInt32Hash(m_seed)));
	m_threads.push_back(new GLES2ThreadTest::EGLThread(egl, m_gl, deInt32Hash(m_seed*200)));

	SharedPtr<GLES2ThreadTest::GLES2Context> contex1;
	SharedPtr<GLES2ThreadTest::GLES2Context> contex2;

	SharedPtr<GLES2ThreadTest::Surface> surface1;
	SharedPtr<GLES2ThreadTest::Surface> surface2;

	// Create contexts
	m_threads[0]->addOperation(new GLES2ThreadTest::CreateContext(m_eglDisplay, m_eglConfig, SharedPtr<GLES2ThreadTest::GLES2Context>(), contex1));
	m_threads[1]->addOperation(new GLES2ThreadTest::CreateContext(m_eglDisplay, m_eglConfig, contex1, contex2));

	// Create surfaces
	m_threads[0]->addOperation(new GLES2ThreadTest::CreatePBufferSurface(m_eglDisplay, m_eglConfig, 400, 400, surface1));
	m_threads[1]->addOperation(new GLES2ThreadTest::CreatePBufferSurface(m_eglDisplay, m_eglConfig, 400, 400, surface2));

	// Make current contexts
	m_threads[0]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[0], m_eglDisplay, surface1, contex1));
	m_threads[1]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[1], m_eglDisplay, surface2, contex2));
	// Operations to check fence sync support
	if (m_config.useFenceSync)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_sync"));
		m_threads[1]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_sync"));
	}


	switch (m_config.resourceType)
	{
		case TestConfig::RESOURCETYPE_BUFFER:
			addBufferOperations();
			break;

		case TestConfig::RESOURCETYPE_TEXTURE:
			addTextureOperations();
			break;

		case TestConfig::RESOURCETYPE_IMAGE:
			addImageOperations();
			break;

		case TestConfig::RESOURCETYPE_VERTEX_SHADER:
			addShaderOperations(GL_VERTEX_SHADER);
			break;

		case TestConfig::RESOURCETYPE_FRAGMENT_SHADER:
			addShaderOperations(GL_FRAGMENT_SHADER);
			break;

		case TestConfig::RESOURCETYPE_PROGRAM:
			addProgramOperations();
			break;

		default:
			DE_ASSERT(false);
	}

	// Relaese contexts
	m_threads[0]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[0], m_eglDisplay, SharedPtr<GLES2ThreadTest::Surface>(), SharedPtr<GLES2ThreadTest::GLES2Context>()));
	m_threads[1]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[0], m_eglDisplay, SharedPtr<GLES2ThreadTest::Surface>(), SharedPtr<GLES2ThreadTest::GLES2Context>()));

	// Destory context
	m_threads[0]->addOperation(new GLES2ThreadTest::DestroyContext(contex1));
	m_threads[1]->addOperation(new GLES2ThreadTest::DestroyContext(contex2));

	// Destroy surfaces
	m_threads[0]->addOperation(new GLES2ThreadTest::DestroySurface(m_eglDisplay, surface1));
	m_threads[1]->addOperation(new GLES2ThreadTest::DestroySurface(m_eglDisplay, surface2));
}